

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
          (ClockingDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token globalOrDefault,
          Token clocking,Token blockName,Token at,EventExpressionSyntax *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClocking,
          NamedBlockClauseSyntax *endBlockName)

{
  pointer ppMVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  EventExpressionSyntax *pEVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  EventExpressionSyntax *local_38;
  
  uVar6 = globalOrDefault._0_8_;
  uVar8 = clocking._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClockingDeclaration,attributes);
  (this->globalOrDefault).kind = (short)uVar6;
  (this->globalOrDefault).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->globalOrDefault).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->globalOrDefault).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->globalOrDefault).info = globalOrDefault.info;
  (this->clocking).kind = (short)uVar8;
  (this->clocking).field_0x2 = (char)((ulong)uVar8 >> 0x10);
  (this->clocking).numFlags = (NumericTokenFlags)(char)((ulong)uVar8 >> 0x18);
  (this->clocking).rawLen = (int)((ulong)uVar8 >> 0x20);
  (this->clocking).info = clocking.info;
  (this->blockName).kind = blockName.kind;
  (this->blockName).field_0x2 = blockName._2_1_;
  (this->blockName).numFlags = (NumericTokenFlags)blockName.numFlags.raw;
  (this->blockName).rawLen = blockName.rawLen;
  (this->blockName).info = blockName.info;
  (this->at).kind = at.kind;
  (this->at).field_0x2 = at._2_1_;
  (this->at).numFlags = (NumericTokenFlags)at.numFlags.raw;
  (this->at).rawLen = at.rawLen;
  (this->at).info = at.info;
  local_38 = event;
  not_null<slang::syntax::EventExpressionSyntax*>::
  not_null<slang::syntax::EventExpressionSyntax*,void>
            ((not_null<slang::syntax::EventExpressionSyntax*> *)&this->event,&local_38);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  SVar3 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar2 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar2;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473020;
  (this->endClocking).kind = endClocking.kind;
  (this->endClocking).field_0x2 = endClocking._2_1_;
  (this->endClocking).numFlags = (NumericTokenFlags)endClocking.numFlags.raw;
  (this->endClocking).rawLen = endClocking.rawLen;
  (this->endClocking).info = endClocking.info;
  this->endBlockName = endBlockName;
  pEVar5 = not_null<slang::syntax::EventExpressionSyntax_*>::get(&this->event);
  (pEVar5->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    **(undefined8 **)((long)ppMVar1 + lVar7) = this;
  }
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClockingDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token globalOrDefault, Token clocking, Token blockName, Token at, EventExpressionSyntax& event, Token semi, const SyntaxList<MemberSyntax>& items, Token endClocking, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClockingDeclaration, attributes), globalOrDefault(globalOrDefault), clocking(clocking), blockName(blockName), at(at), event(&event), semi(semi), items(items), endClocking(endClocking), endBlockName(endBlockName) {
        this->event->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }